

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
uninitialized_move_n
          (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *x,allocator_type *alloc)

{
  template_ElementType<2L> *ptVar1;
  template_ElementType<2L> *ptVar2;
  long lVar3;
  
  btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>::
  GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                *)x);
  ptVar1 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                           *)this);
  ptVar2 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                           *)x);
  for (lVar3 = 0; n << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)&ptVar2[(int)j].value + lVar3) =
         *(undefined4 *)((long)&ptVar1[(int)i].value + lVar3);
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                            const size_type j, btree_node *x,
                            allocator_type *alloc) {
    absl::container_internal::SanitizerUnpoisonMemoryRegion(
        x->slot(j), n * sizeof(slot_type));
    for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
         src != end; ++src, ++dest) {
      slot_type::construct(alloc, dest, src);
    }
  }